

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

void Gia_ManCollectSeqTest(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *__ptr;
  long lVar2;
  ulong uVar3;
  int level;
  timespec ts;
  uint local_4c;
  long local_48;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    local_48 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  local_4c = 0;
  if (p->nRegs < p->vCos->nSize) {
    uVar3 = 0;
    do {
      if ((int)(uVar3 / 10000) * 10000 == (int)uVar3) {
        printf("%8d finished...\r",uVar3);
      }
      __ptr = Gia_ManCollectSeq(p,(int *)&local_4c,1);
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
      }
      free(__ptr);
      local_4c = (int)uVar3 + 1;
      uVar3 = (ulong)local_4c;
    } while ((int)local_4c < p->vCos->nSize - p->nRegs);
  }
  level = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = -1;
  }
  else {
    lVar2 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  lVar2 = lVar2 + local_48;
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)lVar2 / 1000000.0);
  return;
}

Assistant:

void Gia_ManCollectSeqTest( Gia_Man_t * p )
{
    Vec_Int_t * vObjs;
    int i;
    abctime clk = Abc_Clock();
    for ( i = 0; i < Gia_ManPoNum(p); i++ )
    {
        if ( i % 10000 == 0 )
            printf( "%8d finished...\r", i );

        vObjs = Gia_ManCollectSeq( p, &i, 1 );
//        printf( "%d ", Vec_IntSize(vObjs) );
        Vec_IntFree( vObjs );
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

}